

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O2

CTcSymbol * CTcSymPropBase::read_from_sym_file(CVmFile *fp)

{
  undefined1 *puVar1;
  tctarg_prop_id_t prop;
  CTcPrsSymtab *this;
  byte bVar2;
  char *__s;
  size_t sVar3;
  CTcSymbol *pCVar4;
  CTcSymProp *this_00;
  char *siz;
  
  __s = CTcSymbolBase::base_read_from_sym_file(fp);
  if (__s == (char *)0x0) {
    this_00 = (CTcSymProp *)0x0;
  }
  else {
    bVar2 = CVmFile::read_byte(fp);
    this = G_prs->global_symtab_;
    sVar3 = strlen(__s);
    siz = __s;
    pCVar4 = CTcPrsSymtab::find(this,__s,sVar3);
    if (pCVar4 == (CTcSymbol *)0x0) {
      bVar2 = (bVar2 & 4) >> 2;
    }
    else {
      if ((bVar2 & 4) != 0) {
        return pCVar4;
      }
      if (*(int *)&(pCVar4->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24
          == 3) {
        return pCVar4;
      }
      bVar2 = 0;
    }
    this_00 = (CTcSymProp *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x30,(size_t)siz);
    sVar3 = strlen(__s);
    prop = G_cg->next_prop_;
    G_cg->next_prop_ = prop + 1;
    CTcSymProp::CTcSymProp(this_00,__s,sVar3,0,prop);
    if (bVar2 != 0) {
      puVar1 = &(this_00->super_CTcSymPropBase).field_0x2a;
      *puVar1 = *puVar1 | 4;
    }
  }
  return (CTcSymbol *)this_00;
}

Assistant:

CTcSymbol *CTcSymPropBase::read_from_sym_file(CVmFile *fp)
{
    /* read the symbol name */
    const char *sym;
    if ((sym = base_read_from_sym_file(fp)) == 0)
        return 0;

    /* read and decode the flags of interest */
    char flags = fp->read_byte();
    int weak = flags & 4;

    /* 
     *   If this property is already defined, this is a harmless redefinition
     *   - every symbol file can define the same property without any
     *   problem.  Indicate the harmless redefinition by returning the
     *   original symbol.  
     */
    CTcSymbol *old_entry = G_prs->get_global_symtab()->find(sym, strlen(sym));
    if (old_entry != 0 && old_entry->get_type() == TC_SYM_PROP)
        return old_entry;

    /* 
     *   if there's an old entry of a different type, and our entry is weak,
     *   the other symbol overrides our property definition 
     */
    if (old_entry != 0 && weak)
        return old_entry;

    /* create and return the new symbol */
    CTcSymProp *prop_entry =
        new CTcSymProp(sym, strlen(sym), FALSE, G_cg->new_prop_id());

    /* if our definition is weak, record that */
    if (weak)
        prop_entry->set_weak(TRUE);

    /* return the new entry */
    return prop_entry;
}